

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::console::console_func>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 *local_38;
  console_func *pDst;
  console_func *pSrc_end;
  console_func *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (undefined8 *)pDst_void;
  for (pSrc_end = (console_func *)pSrc_void;
      pSrc_end != (console_func *)((long)pSrc_void + (ulong)num * 0x10); pSrc_end = pSrc_end + 1) {
    *local_38 = pSrc_end->m_func;
    local_38[1] = pSrc_end->m_pData;
    local_38 = local_38 + 2;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }